

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O0

UConverter *
ucnv_createAlgorithmicConverter_63
          (UConverter *myUConverter,UConverterType type,char *locale,uint32_t options,
          UErrorCode *err)

{
  undefined1 local_70 [8];
  UConverterLoadArgs stackArgs;
  UConverterSharedData *sharedData;
  UConverter *cnv;
  UErrorCode *err_local;
  uint32_t options_local;
  char *locale_local;
  UConverterType type_local;
  UConverter *myUConverter_local;
  
  memset(local_70,0,0x28);
  local_70._0_4_ = 0x28;
  if ((type < UCNV_SBCS) || (UCNV_COMPOUND_TEXT < type)) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
    myUConverter_local = (UConverter *)0x0;
  }
  else {
    stackArgs.locale = (char *)converterData[type];
    if (((UConverterSharedData *)stackArgs.locale == (UConverterSharedData *)0x0) ||
       (((UConverterSharedData *)stackArgs.locale)->isReferenceCounted != '\0')) {
      *err = U_ILLEGAL_ARGUMENT_ERROR;
      myUConverter_local = (UConverter *)0x0;
    }
    else {
      stackArgs.pkg = "";
      stackArgs.nestedLoads = options;
      stackArgs.name = locale;
      myUConverter_local =
           ucnv_createConverterFromSharedData_63
                     (myUConverter,(UConverterSharedData *)stackArgs.locale,
                      (UConverterLoadArgs *)local_70,err);
    }
  }
  return myUConverter_local;
}

Assistant:

UConverter *
ucnv_createAlgorithmicConverter(UConverter *myUConverter,
                                UConverterType type,
                                const char *locale, uint32_t options,
                                UErrorCode *err) {
    UConverter *cnv;
    const UConverterSharedData *sharedData;
    UConverterLoadArgs stackArgs=UCNV_LOAD_ARGS_INITIALIZER;

    UTRACE_ENTRY_OC(UTRACE_UCNV_OPEN_ALGORITHMIC);
    UTRACE_DATA1(UTRACE_OPEN_CLOSE, "open algorithmic converter type %d", (int32_t)type);

    if(type<0 || UCNV_NUMBER_OF_SUPPORTED_CONVERTER_TYPES<=type) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        UTRACE_EXIT_STATUS(U_ILLEGAL_ARGUMENT_ERROR);
        return NULL;
    }

    sharedData = converterData[type];
    if(sharedData == NULL || sharedData->isReferenceCounted) {
        /* not a valid type, or not an algorithmic converter */
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        UTRACE_EXIT_STATUS(U_ILLEGAL_ARGUMENT_ERROR);
        return NULL;
    }

    stackArgs.name = "";
    stackArgs.options = options;
    stackArgs.locale=locale;
    cnv = ucnv_createConverterFromSharedData(
            myUConverter, (UConverterSharedData *)sharedData,
            &stackArgs, err);

    UTRACE_EXIT_PTR_STATUS(cnv, *err);
    return cnv;
}